

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ArenaImpl *this_00;
  uint uVar4;
  Rep *pRVar5;
  string *psVar6;
  Version *msg;
  FileDescriptorProto *msg_00;
  char cVar7;
  uint32 res;
  uint tag;
  char *ptr_00;
  int iVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_bool> pVar10;
  
LAB_00218d81:
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
        (long)(ctx->super_EpsCopyInputStream).limit_) {
      return (char *)(byte *)ptr;
    }
    pVar10 = internal::EpsCopyInputStream::DoneFallback
                       (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
    ptr = pVar10.first;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)(byte *)ptr;
    }
  }
  bVar1 = *ptr;
  pVar9.second._0_1_ = bVar1;
  pVar9.first = (char *)((byte *)ptr + 1);
  pVar9._9_7_ = 0;
  if ((char)bVar1 < '\0') {
    bVar2 = ((byte *)ptr)[1];
    res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
    if ((char)bVar2 < '\0') {
      pVar9 = internal::ReadTagFallback(ptr,res);
      if (pVar9.first == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      pVar9.second = res;
      pVar9.first = (char *)((byte *)ptr + 2);
      pVar9._12_4_ = 0;
    }
  }
  ptr_00 = pVar9.first;
  tag = pVar9.second;
  uVar4 = (uint)(pVar9._8_8_ >> 3) & 0x1fffffff;
  cVar7 = (char)pVar9.second;
  if (uVar4 == 0xf) {
    if (cVar7 == 'z') {
      ptr = ptr_00 + -1;
      do {
        pRVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
          iVar8 = (this->proto_file_).super_RepeatedPtrFieldBase.total_size_;
LAB_00218f6e:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar8 + 1);
          pRVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = pRVar5->allocated_size;
LAB_00218f80:
          pRVar5->allocated_size = iVar8 + 1;
          msg_00 = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                             ((this->proto_file_).super_RepeatedPtrFieldBase.arena_);
          pRVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
          (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          pRVar5->elements[iVar8] = msg_00;
        }
        else {
          iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
          iVar8 = pRVar5->allocated_size;
          if (iVar8 <= iVar3) {
            if (iVar8 == (this->proto_file_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_00218f6e;
            goto LAB_00218f80;
          }
          (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          msg_00 = (FileDescriptorProto *)pRVar5->elements[iVar3];
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                        (ctx,msg_00,(char *)((byte *)ptr + 1));
        if ((byte *)ptr == (byte *)0x0) {
          return (char *)0x0;
        }
      } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x7a));
      goto LAB_00218d81;
    }
  }
  else {
    if (uVar4 == 2) {
      if (cVar7 != '\x12') goto LAB_00218ffa;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar6 = (this->parameter_).ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (&this->parameter_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar6 = (this->parameter_).ptr_;
      }
      ptr = internal::InlineGreedyStringParser(psVar6,ptr_00,ctx);
      goto LAB_0021901a;
    }
    if (uVar4 == 3) {
      if (cVar7 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        msg = this->compiler_version_;
        if (msg == (Version *)0x0) {
          msg = Arena::CreateMaybeMessage<google::protobuf::compiler::Version>((Arena *)0x0);
          this->compiler_version_ = msg;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::compiler::Version>
                        (ctx,msg,ptr_00);
        goto LAB_0021901a;
      }
      goto LAB_00218ffa;
    }
    if ((uVar4 == 1) && (cVar7 == '\n')) {
      ptr = ptr_00 + -1;
      do {
        pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
          iVar8 = (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_;
LAB_00218e2c:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_to_generate_).super_RepeatedPtrFieldBase,iVar8 + 1);
          pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = pRVar5->allocated_size;
LAB_00218e3c:
          pRVar5->allocated_size = iVar8 + 1;
          this_00 = (ArenaImpl *)(this->file_to_generate_).super_RepeatedPtrFieldBase.arena_;
          if (this_00 == (ArenaImpl *)0x0) {
            psVar6 = (string *)operator_new(0x20);
          }
          else {
            if (this_00[1].initial_block_ != (Block *)0x0) {
              Arena::OnArenaAllocation
                        ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            }
            psVar6 = (string *)
                     internal::ArenaImpl::AllocateAlignedAndAddCleanup
                               (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
          }
          (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
          psVar6->_M_string_length = 0;
          (psVar6->field_2)._M_local_buf[0] = '\0';
          pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
          (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          pRVar5->elements[iVar8] = psVar6;
        }
        else {
          iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
          iVar8 = pRVar5->allocated_size;
          if (iVar8 <= iVar3) {
            if (iVar8 == (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_00218e2c;
            goto LAB_00218e3c;
          }
          (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          psVar6 = (string *)pRVar5->elements[iVar3];
        }
        ptr = internal::InlineGreedyStringParser(psVar6,(char *)((byte *)ptr + 1),ctx);
        if ((byte *)ptr == (byte *)0x0) {
          return (char *)0x0;
        }
      } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 10));
      goto LAB_00218d81;
    }
  }
LAB_00218ffa:
  if ((tag == 0) || ((tag & 7) == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
    return ptr_00;
  }
  ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
LAB_0021901a:
  if ((byte *)ptr == (byte *)0x0) {
    return (char *)0x0;
  }
  goto LAB_00218d81;
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_file_to_generate(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_parameter(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}